

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_AEAD.c
# Opt level: O0

EverCrypt_Error_error_code
EverCrypt_AEAD_decrypt
          (EverCrypt_AEAD_state_s *s,uint8_t *iv,uint32_t iv_len,uint8_t *ad,uint32_t ad_len,
          uint8_t *cipher,uint32_t cipher_len,uint8_t *tag,uint8_t *dst)

{
  Spec_Cipher_Expansion_impl SVar1;
  Spec_Cipher_Expansion_impl i;
  uint8_t *cipher_local;
  uint32_t ad_len_local;
  uint8_t *ad_local;
  uint32_t iv_len_local;
  uint8_t *iv_local;
  EverCrypt_AEAD_state_s *s_local;
  
  if (s == (EverCrypt_AEAD_state_s *)0x0) {
    s_local._7_1_ = '\x02';
  }
  else {
    SVar1 = s->impl;
    if (SVar1 == '\0') {
      s_local._7_1_ = decrypt_chacha20_poly1305(s,iv,iv_len,ad,ad_len,cipher,cipher_len,tag,dst);
    }
    else if (SVar1 == '\x01') {
      s_local._7_1_ = decrypt_aes128_gcm(s,iv,iv_len,ad,ad_len,cipher,cipher_len,tag,dst);
    }
    else {
      if (SVar1 != '\x02') {
        fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_AEAD.c"
                ,0x5f4);
        exit(0xfd);
      }
      s_local._7_1_ = decrypt_aes256_gcm(s,iv,iv_len,ad,ad_len,cipher,cipher_len,tag,dst);
    }
  }
  return s_local._7_1_;
}

Assistant:

EverCrypt_Error_error_code
EverCrypt_AEAD_decrypt(
  EverCrypt_AEAD_state_s *s,
  uint8_t *iv,
  uint32_t iv_len,
  uint8_t *ad,
  uint32_t ad_len,
  uint8_t *cipher,
  uint32_t cipher_len,
  uint8_t *tag,
  uint8_t *dst
)
{
  if (s == NULL)
  {
    return EverCrypt_Error_InvalidKey;
  }
  Spec_Cipher_Expansion_impl i = (*s).impl;
  switch (i)
  {
    case Spec_Cipher_Expansion_Vale_AES128:
      {
        return decrypt_aes128_gcm(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    case Spec_Cipher_Expansion_Vale_AES256:
      {
        return decrypt_aes256_gcm(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    case Spec_Cipher_Expansion_Hacl_CHACHA20:
      {
        return decrypt_chacha20_poly1305(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}